

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O2

void __thiscall
QStandardItemPrivate::sortChildren(QStandardItemPrivate *this,int column,SortOrder order)

{
  QList<QStandardItem_*> *this_00;
  QStandardItem *this_01;
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  iterator iVar5;
  int *piVar6;
  QStandardItem *pQVar7;
  pointer ppQVar8;
  iterator iVar9;
  iterator iVar10;
  int c;
  int column_00;
  int i;
  ulong uVar11;
  int iVar12;
  long in_FS_OFFSET;
  QStandardItem *itm;
  QModelIndex local_108;
  QModelIndex local_f0;
  QArrayDataPointer<QStandardItem_*> local_d8;
  QArrayDataPointer<QModelIndex> local_b8;
  QArrayDataPointer<QModelIndex> local_98;
  QArrayDataPointer<int> local_78;
  QArrayDataPointer<std::pair<QStandardItem_*,_int>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (column < this->columns) {
    this_01 = this->q_ptr;
    local_58.size = 0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (pair<QStandardItem_*,_int> *)0x0;
    local_78.d = (Data *)0x0;
    local_78.ptr = (int *)0x0;
    local_78.size = 0;
    QList<std::pair<QStandardItem_*,_int>_>::reserve
              ((QList<std::pair<QStandardItem_*,_int>_> *)&local_58,(long)this->rows);
    QList<int>::reserve((QList<int> *)&local_78,(long)this->rows);
    iVar12 = 0;
    while (local_b8.d = (Data *)CONCAT44(local_b8.d._4_4_,iVar12), iVar12 < this->rows) {
      local_98.d = (Data *)QStandardItem::child(this_01,iVar12,column);
      if ((QStandardItem *)local_98.d == (QStandardItem *)0x0) {
        QList<int>::append((QList<int> *)&local_78,(parameter_type)local_b8.d);
      }
      else {
        QList<std::pair<QStandardItem*,int>>::emplaceBack<QStandardItem*&,int&>
                  ((QList<std::pair<QStandardItem*,int>> *)&local_58,(QStandardItem **)&local_98,
                   (int *)&local_b8);
      }
      iVar12 = (parameter_type)local_b8.d + 1;
    }
    iVar4 = QList<std::pair<QStandardItem_*,_int>_>::begin
                      ((QList<std::pair<QStandardItem_*,_int>_> *)&local_58);
    iVar5 = QList<std::pair<QStandardItem_*,_int>_>::end
                      ((QList<std::pair<QStandardItem_*,_int>_> *)&local_58);
    if (order == AscendingOrder) {
      std::
      __stable_sort<QList<std::pair<QStandardItem*,int>>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<QStandardItemModelLessThan>>
                (iVar4.i,iVar5.i);
    }
    else {
      std::
      __stable_sort<QList<std::pair<QStandardItem*,int>>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<QStandardItemModelGreaterThan>>
                (iVar4.i,iVar5.i);
    }
    local_98.size = 0;
    local_b8.size = 0;
    local_98.d = (Data *)0x0;
    local_98.ptr = (QModelIndex *)0x0;
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (QModelIndex *)0x0;
    local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.ptr = (QStandardItem **)&DAT_aaaaaaaaaaaaaaaa;
    QList<QStandardItem_*>::QList((QList<QStandardItem_*> *)&local_d8,(this->children).d.size);
    for (uVar11 = 0; (long)uVar11 < (long)this->rows; uVar11 = uVar11 + 1) {
      piVar6 = &local_58.ptr[uVar11].second;
      if ((ulong)local_58.size <= uVar11) {
        piVar6 = local_78.ptr + (uVar11 - local_58.size);
      }
      iVar12 = *piVar6;
      for (column_00 = 0; column_00 < this->columns; column_00 = column_00 + 1) {
        pQVar7 = QStandardItem::child(this_01,iVar12,column_00);
        iVar3 = childIndex(this,(int)uVar11,column_00);
        ppQVar8 = QList<QStandardItem_*>::data((QList<QStandardItem_*> *)&local_d8);
        ppQVar8[iVar3] = pQVar7;
        pQVar1 = &this->model->super_QAbstractItemModel;
        if (pQVar1 != (QAbstractItemModel *)0x0) {
          local_108.r = iVar12;
          local_108.c = column_00;
          local_108.i = (quintptr)this_01;
          local_108.m.ptr = pQVar1;
          local_f0.r = iVar12;
          local_f0.c = column_00;
          local_f0.i = (quintptr)this_01;
          local_f0.m.ptr = pQVar1;
          bVar2 = QMultiHash<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>::contains
                            ((QMultiHash<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>
                              *)(*(long *)(pQVar1 + 8) + 0x90),(QModelIndexWrapper *)&local_108);
          if (bVar2) {
            local_108.m.ptr = &this->model->super_QAbstractItemModel;
            local_108.r = (int)uVar11;
            local_108.c = column_00;
            local_108.i = (quintptr)this_01;
            QList<QModelIndex>::emplaceBack<QModelIndex_const&>
                      ((QList<QModelIndex> *)&local_98,&local_f0);
            QList<QModelIndex>::emplaceBack<QModelIndex_const&>
                      ((QList<QModelIndex> *)&local_b8,&local_108);
          }
        }
      }
    }
    this_00 = &this->children;
    QArrayDataPointer<QStandardItem_*>::operator=(&this_00->d,&local_d8);
    if (this->model != (QStandardItemModel *)0x0) {
      QAbstractItemModel::changePersistentIndexList
                ((QList_conflict1 *)this->model,(QList_conflict1 *)&local_98);
    }
    iVar9 = QList<QStandardItem_*>::begin(this_00);
    while( true ) {
      iVar10 = QList<QStandardItem_*>::end(this_00);
      if (iVar9.i == iVar10.i) break;
      if (*iVar9.i != (QStandardItem *)0x0) {
        sortChildren(((*iVar9.i)->d_ptr).d,column,order);
      }
      iVar9.i = iVar9.i + 1;
    }
    QArrayDataPointer<QStandardItem_*>::~QArrayDataPointer(&local_d8);
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<std::pair<QStandardItem_*,_int>_>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStandardItemPrivate::sortChildren(int column, Qt::SortOrder order)
{
    Q_Q(QStandardItem);
    if (column >= columnCount())
        return;

    QList<std::pair<QStandardItem*, int> > sortable;
    QList<int> unsortable;

    sortable.reserve(rowCount());
    unsortable.reserve(rowCount());

    for (int row = 0; row < rowCount(); ++row) {
        QStandardItem *itm = q->child(row, column);
        if (itm)
            sortable.emplace_back(itm, row);
        else
            unsortable.append(row);
    }

    if (order == Qt::AscendingOrder) {
        QStandardItemModelLessThan lt;
        std::stable_sort(sortable.begin(), sortable.end(), lt);
    } else {
        QStandardItemModelGreaterThan gt;
        std::stable_sort(sortable.begin(), sortable.end(), gt);
    }

    QModelIndexList changedPersistentIndexesFrom, changedPersistentIndexesTo;
    QList<QStandardItem*> sorted_children(children.size());
    for (int i = 0; i < rowCount(); ++i) {
        int r = (i < sortable.size()
                 ? sortable.at(i).second
                 : unsortable.at(i - sortable.size()));
        for (int c = 0; c < columnCount(); ++c) {
            QStandardItem *itm = q->child(r, c);
            sorted_children[childIndex(i, c)] = itm;
            if (model) {
                QModelIndex from = model->createIndex(r, c, q);
                if (model->d_func()->persistent.indexes.contains(from)) {
                    QModelIndex to = model->createIndex(i, c, q);
                    changedPersistentIndexesFrom.append(from);
                    changedPersistentIndexesTo.append(to);
                }
            }
        }
    }

    children = sorted_children;

    if (model) {
        model->changePersistentIndexList(changedPersistentIndexesFrom, changedPersistentIndexesTo);
    }

    QList<QStandardItem*>::iterator it;
    for (it = children.begin(); it != children.end(); ++it) {
        if (*it)
            (*it)->d_func()->sortChildren(column, order);
    }
}